

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_cf_socket_peek(Curl_cfilter *cf,Curl_easy *data,curl_socket_t *psock,
                            Curl_sockaddr_ex **paddr,char **pr_ip_str,int *pr_port,char **pl_ip_str,
                            int *pl_port)

{
  void *pvVar1;
  _Bool _Var2;
  cf_socket_ctx *ctx;
  int *pr_port_local;
  char **pr_ip_str_local;
  Curl_sockaddr_ex **paddr_local;
  curl_socket_t *psock_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  _Var2 = cf_is_socket(cf);
  if ((_Var2) && (cf->ctx != (void *)0x0)) {
    pvVar1 = cf->ctx;
    if (psock != (curl_socket_t *)0x0) {
      *psock = *(curl_socket_t *)((long)pvVar1 + 0x98);
    }
    if (paddr != (Curl_sockaddr_ex **)0x0) {
      *paddr = (Curl_sockaddr_ex *)((long)pvVar1 + 8);
    }
    if (pr_ip_str != (char **)0x0) {
      *pr_ip_str = (char *)((long)pvVar1 + 0xe0);
    }
    if (pr_port != (int *)0x0) {
      *pr_port = *(int *)((long)pvVar1 + 0x110);
    }
    if ((pl_port != (int *)0x0) || (pl_ip_str != (char **)0x0)) {
      set_local_ip(cf,data);
      if (pl_ip_str != (char **)0x0) {
        *pl_ip_str = (char *)((long)pvVar1 + 0x114);
      }
      if (pl_port != (int *)0x0) {
        *pl_port = *(int *)((long)pvVar1 + 0x144);
      }
    }
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    cf_local._4_4_ = CURLE_FAILED_INIT;
  }
  return cf_local._4_4_;
}

Assistant:

CURLcode Curl_cf_socket_peek(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             curl_socket_t *psock,
                             const struct Curl_sockaddr_ex **paddr,
                             const char **pr_ip_str, int *pr_port,
                             const char **pl_ip_str, int *pl_port)
{
  if(cf_is_socket(cf) && cf->ctx) {
    struct cf_socket_ctx *ctx = cf->ctx;

    if(psock)
      *psock = ctx->sock;
    if(paddr)
      *paddr = &ctx->addr;
    if(pr_ip_str)
      *pr_ip_str = ctx->r_ip;
    if(pr_port)
      *pr_port = ctx->r_port;
    if(pl_port ||pl_ip_str) {
      set_local_ip(cf, data);
      if(pl_ip_str)
        *pl_ip_str = ctx->l_ip;
      if(pl_port)
        *pl_port = ctx->l_port;
    }
    return CURLE_OK;
  }
  return CURLE_FAILED_INIT;
}